

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

long timediff(timeval newer,timeval older)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0x7fffffffffffffff;
  lVar2 = newer.tv_sec - older.tv_sec;
  if (lVar2 < 0x20c49ba5e353f7) {
    if (lVar2 < -0x20c49ba5e353f6) {
      return -0x8000000000000000;
    }
    lVar1 = (newer.tv_usec - older.tv_usec) / 1000 + lVar2 * 1000;
  }
  return lVar1;
}

Assistant:

long timediff(struct timeval newer, struct timeval older)
{
  timediff_t diff = newer.tv_sec-older.tv_sec;
  if(diff >= (LONG_MAX/1000))
    return LONG_MAX;
  else if(diff <= (LONG_MIN/1000))
    return LONG_MIN;
  return (long)(newer.tv_sec-older.tv_sec)*1000+
    (long)(newer.tv_usec-older.tv_usec)/1000;
}